

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_wally_util.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
cfd::core::WallyUtil::CreateScriptDataFromBytes
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes,int32_t flags)

{
  uint32_t uVar1;
  size_type sVar2;
  uchar *puVar3;
  uchar *puVar4;
  size_type len;
  CfdException *this;
  allocator local_89;
  string local_88;
  CfdSourceLocation local_68;
  int local_4c;
  ulong uStack_48;
  int ret;
  size_t written;
  allocator<unsigned_char> local_2a;
  undefined1 local_29;
  size_type local_28;
  size_t write_max_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvStack_18;
  int32_t flags_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *ret_bytes;
  
  write_max_size._4_4_ = flags;
  pvStack_18 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)bytes;
  bytes_local = __return_storage_ptr__;
  sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)bytes);
  local_29 = 0;
  local_28 = sVar2 + 5;
  ::std::allocator<unsigned_char>::allocator(&local_2a);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,
             sVar2 + 5,&local_2a);
  ::std::allocator<unsigned_char>::~allocator(&local_2a);
  uStack_48 = 0;
  puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(pvStack_18);
  sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvStack_18);
  uVar1 = write_max_size._4_4_;
  puVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      __return_storage_ptr__);
  local_4c = wally_script_push_from_bytes
                       (puVar3,sVar2,uVar1,puVar4,local_28,&stack0xffffffffffffffb8);
  if ((local_4c == 0) && (local_28 < uStack_48)) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,
               uStack_48);
    puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(pvStack_18);
    sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvStack_18);
    uVar1 = write_max_size._4_4_;
    puVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        __return_storage_ptr__);
    len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__
                    );
    local_4c = wally_script_push_from_bytes(puVar3,sVar2,uVar1,puVar4,len,&stack0xffffffffffffffb8);
  }
  if (local_4c == 0) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,
               uStack_48);
    return __return_storage_ptr__;
  }
  local_68.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_wally_util.cpp"
               ,0x2f);
  local_68.filename = local_68.filename + 1;
  local_68.line = 0x95;
  local_68.funcname = "CreateScriptDataFromBytes";
  logger::warn<>(&local_68,"Script push error.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_88,"Script push error.",&local_89);
  CfdException::CfdException(this,kCfdIllegalArgumentError,&local_88);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

std::vector<uint8_t> WallyUtil::CreateScriptDataFromBytes(
    const std::vector<uint8_t>& bytes, int32_t flags) {
  size_t write_max_size = bytes.size() + kMaxVarIntSize;
  std::vector<uint8_t> ret_bytes(write_max_size);
  size_t written = 0;

  int ret = wally_script_push_from_bytes(
      bytes.data(), bytes.size(), flags, ret_bytes.data(), write_max_size,
      &written);
  if (ret == WALLY_OK && write_max_size < written) {
    // サイズ不足の場合はresizeしてリトライ
    ret_bytes.resize(written);
    ret = wally_script_push_from_bytes(
        bytes.data(), bytes.size(), flags, ret_bytes.data(), ret_bytes.size(),
        &written);
  }

  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "Script push error.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Script push error.");
  }
  ret_bytes.resize(written);
  return ret_bytes;
}